

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::FindCMakeResources(char *argv0)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  string_view str;
  bool local_88c;
  byte local_862;
  string local_780;
  byte local_759;
  string local_758;
  undefined1 local_738 [8];
  ifstream fin2;
  string local_530;
  string local_510;
  undefined1 local_4f0 [8];
  string src_dir;
  ifstream fin;
  undefined1 local_2c8 [8];
  string src_dir_txt;
  string dir;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  string prefix;
  char *local_1d0;
  string local_1c8;
  char *local_1a8;
  string local_1a0;
  char *local_180;
  string local_178;
  char *local_158;
  string local_150;
  char *local_130;
  string local_128;
  char *local_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined1 local_70 [8];
  string exe;
  string errorMsg;
  string exe_dir;
  char *argv0_local;
  
  std::__cxx11::string::string((string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(exe.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_70);
  bVar1 = cmsys::SystemTools::FindProgramPath
                    (argv0,(string *)local_70,(string *)(exe.field_2._M_local_buf + 8));
  if (bVar1) {
    cmsys::SystemTools::GetRealPath(&local_a0,(string *)local_70,(string *)0x0);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    cmsys::SystemTools::GetFilenamePath(&local_c0,(string *)local_70);
    std::__cxx11::string::operator=
              ((string *)(errorMsg.field_2._M_local_buf + 8),(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  cmsys::SystemTools::GetActualCaseForPath(&local_e0,(string *)((long)&errorMsg.field_2 + 8));
  std::__cxx11::string::operator=((string *)(errorMsg.field_2._M_local_buf + 8),(string *)&local_e0)
  ;
  std::__cxx11::string::~string((string *)&local_e0);
  local_108 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[7],char_const*>
            (&local_100,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errorMsg.field_2 + 8),(char (*) [7])"/cmake",&local_108);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCommand_abi_cxx11_,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  local_130 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[7],char_const*>
            (&local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errorMsg.field_2 + 8),(char (*) [7])"/ctest",&local_130);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCTestCommand_abi_cxx11_,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  local_158 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[7],char_const*>
            (&local_150,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errorMsg.field_2 + 8),(char (*) [7])"/cpack",&local_158);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCPackCommand_abi_cxx11_,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  local_180 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[11],char_const*>
            (&local_178,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errorMsg.field_2 + 8),(char (*) [11])"/cmake-gui",&local_180);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  local_1a8 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[8],char_const*>
            (&local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errorMsg.field_2 + 8),(char (*) [8])"/ccmake",&local_1a8);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  local_1d0 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[10],char_const*>
            (&local_1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errorMsg.field_2 + 8),(char (*) [10])"/cmcldeps",&local_1d0);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  str = (string_view)
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((string *)(errorMsg.field_2._M_local_buf + 8));
  prefix.field_2._8_8_ = str._M_len;
  bVar1 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])0x1263788);
  if (bVar1) {
    std::__cxx11::string::size();
    cmStrLen<5ul>((char (*) [5])0x1263788);
    std::__cxx11::string::substr((ulong)local_200,(ulong)((long)&errorMsg.field_2 + 8));
    cmStrCat<std::__cxx11::string_const&,char_const(&)[18]>
              (&local_220,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
               (char (*) [18])"/share/cmake-3.29");
    std::__cxx11::string::operator=
              ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[32]>
              (&local_240,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
               (char (*) [32])"/doc/cmake-3.29/html/index.html");
    bVar1 = cmsys::SystemTools::FileExists(&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    if (bVar1) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
                (&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                 (char (*) [21])"/doc/cmake-3.29/html");
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    }
    std::__cxx11::string::~string((string *)local_200);
  }
  bVar2 = std::__cxx11::string::empty();
  local_862 = 1;
  if ((bVar2 & 1) == 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[21]>
              (&local_280,&cmSystemToolsCMakeRoot_abi_cxx11_,(char (*) [21])"/Modules/CMake.cmake");
    bVar1 = cmsys::SystemTools::FileExists(&local_280);
    local_862 = bVar1 ^ 0xff;
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((local_862 & 1) != 0) {
    cmsys::SystemTools::GetFilenamePath
              ((string *)((long)&src_dir_txt.field_2 + 8),(string *)((long)&errorMsg.field_2 + 8));
    cmStrCat<std::__cxx11::string&,char_const(&)[31]>
              ((string *)local_2c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&src_dir_txt.field_2 + 8),(char (*) [31])"/CMakeFiles/CMakeSourceDir.txt");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream((void *)((long)&src_dir.field_2 + 8),pcVar4,_S_in);
    std::__cxx11::string::string((string *)local_4f0);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&src_dir.field_2 + *(long *)(src_dir.field_2._8_8_ + -0x18) + 8
                              ));
    if (((bVar1) &&
        (bVar1 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)((long)&src_dir.field_2 + 8),(string *)local_4f0,(bool *)0x0,
                            0xffffffffffffffff), bVar1)) &&
       (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_4f0), bVar1)) {
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)local_4f0);
    }
    else {
      cmsys::SystemTools::GetFilenamePath(&local_510,(string *)((long)&src_dir_txt.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(src_dir_txt.field_2._M_local_buf + 8),(string *)&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      cmStrCat<std::__cxx11::string&,char_const(&)[31]>
                (&local_530,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (src_dir_txt.field_2._M_local_buf + 8),
                 (char (*) [31])"/CMakeFiles/CMakeSourceDir.txt");
      std::__cxx11::string::operator=((string *)local_2c8,(string *)&local_530);
      std::__cxx11::string::~string((string *)&local_530);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_738,pcVar4,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)(local_738 + (long)*(_func_int **)((long)local_738 + -0x18)));
      if (((bVar1) &&
          (bVar1 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_738,(string *)local_4f0,(bool *)0x0,
                              0xffffffffffffffff), bVar1)) &&
         (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_4f0), bVar1)) {
        std::__cxx11::string::operator=
                  ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)local_4f0);
      }
      std::ifstream::~ifstream(local_738);
    }
    uVar3 = std::__cxx11::string::empty();
    local_759 = 0;
    local_88c = false;
    if ((uVar3 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      local_88c = false;
      if ((uVar3 & 1) != 0) {
        cmStrCat<std::__cxx11::string&,char_const(&)[34]>
                  (&local_758,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&src_dir_txt.field_2 + 8),
                   (char (*) [34])"/Utilities/Sphinx/html/index.html");
        local_759 = 1;
        local_88c = cmsys::SystemTools::FileExists(&local_758);
      }
    }
    if ((local_759 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_758);
    }
    if (local_88c != false) {
      cmStrCat<std::__cxx11::string&,char_const(&)[23]>
                (&local_780,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&src_dir_txt.field_2 + 8),(char (*) [23])"/Utilities/Sphinx/html");
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&local_780);
      std::__cxx11::string::~string((string *)&local_780);
    }
    std::__cxx11::string::~string((string *)local_4f0);
    std::ifstream::~ifstream((void *)((long)&src_dir.field_2 + 8));
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::string::~string((string *)(src_dir_txt.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(exe.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(errorMsg.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmSystemTools::FindCMakeResources(const char* argv0)
{
  std::string exe_dir;
#if defined(_WIN32) && !defined(__CYGWIN__)
  (void)argv0; // ignore this on windows
  wchar_t modulepath[_MAX_PATH];
  ::GetModuleFileNameW(nullptr, modulepath, sizeof(modulepath));
  std::string path = cmsys::Encoding::ToNarrow(modulepath);
  std::string realPath =
    cmSystemTools::GetRealPathResolvingWindowsSubst(path, nullptr);
  if (realPath.empty()) {
    realPath = path;
  }
  exe_dir = cmSystemTools::GetFilenamePath(realPath);
#elif defined(__APPLE__)
  (void)argv0; // ignore this on OS X
#  define CM_EXE_PATH_LOCAL_SIZE 16384
  char exe_path_local[CM_EXE_PATH_LOCAL_SIZE];
#  if defined(MAC_OS_X_VERSION_10_3) && !defined(MAC_OS_X_VERSION_10_4)
  unsigned long exe_path_size = CM_EXE_PATH_LOCAL_SIZE;
#  else
  uint32_t exe_path_size = CM_EXE_PATH_LOCAL_SIZE;
#  endif
#  undef CM_EXE_PATH_LOCAL_SIZE
  char* exe_path = exe_path_local;
  if (_NSGetExecutablePath(exe_path, &exe_path_size) < 0) {
    exe_path = static_cast<char*>(malloc(exe_path_size));
    _NSGetExecutablePath(exe_path, &exe_path_size);
  }
  exe_dir =
    cmSystemTools::GetFilenamePath(cmSystemTools::GetRealPath(exe_path));
  if (exe_path != exe_path_local) {
    free(exe_path);
  }
  if (cmSystemTools::GetFilenameName(exe_dir) == "MacOS") {
    // The executable is inside an application bundle.
    // Look for ..<CMAKE_BIN_DIR> (install tree) and then fall back to
    // ../../../bin (build tree).
    exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
    if (cmSystemTools::FileExists(exe_dir + CMAKE_BIN_DIR "/cmake")) {
      exe_dir += CMAKE_BIN_DIR;
    } else {
      exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
      exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
    }
  }
#else
  std::string errorMsg;
  std::string exe;
  if (cmSystemTools::FindProgramPath(argv0, exe, errorMsg)) {
    // remove symlinks
    exe = cmSystemTools::GetRealPath(exe);
    exe_dir = cmSystemTools::GetFilenamePath(exe);
  } else {
    // ???
  }
#endif
  exe_dir = cmSystemTools::GetActualCaseForPath(exe_dir);
  cmSystemToolsCMakeCommand =
    cmStrCat(exe_dir, "/cmake", cmSystemTools::GetExecutableExtension());
#ifdef CMAKE_BOOTSTRAP
  // The bootstrap cmake does not provide the other tools,
  // so use the directory where they are about to be built.
  exe_dir = CMAKE_BOOTSTRAP_BINARY_DIR "/bin";
#endif
  cmSystemToolsCTestCommand =
    cmStrCat(exe_dir, "/ctest", cmSystemTools::GetExecutableExtension());
  cmSystemToolsCPackCommand =
    cmStrCat(exe_dir, "/cpack", cmSystemTools::GetExecutableExtension());
  cmSystemToolsCMakeGUICommand =
    cmStrCat(exe_dir, "/cmake-gui", cmSystemTools::GetExecutableExtension());
  if (!cmSystemTools::FileExists(cmSystemToolsCMakeGUICommand)) {
    cmSystemToolsCMakeGUICommand.clear();
  }
  cmSystemToolsCMakeCursesCommand =
    cmStrCat(exe_dir, "/ccmake", cmSystemTools::GetExecutableExtension());
  if (!cmSystemTools::FileExists(cmSystemToolsCMakeCursesCommand)) {
    cmSystemToolsCMakeCursesCommand.clear();
  }
  cmSystemToolsCMClDepsCommand =
    cmStrCat(exe_dir, "/cmcldeps", cmSystemTools::GetExecutableExtension());
  if (!cmSystemTools::FileExists(cmSystemToolsCMClDepsCommand)) {
    cmSystemToolsCMClDepsCommand.clear();
  }

#ifndef CMAKE_BOOTSTRAP
  // Install tree has
  // - "<prefix><CMAKE_BIN_DIR>/cmake"
  // - "<prefix><CMAKE_DATA_DIR>"
  // - "<prefix><CMAKE_DOC_DIR>"
  if (cmHasLiteralSuffix(exe_dir, CMAKE_BIN_DIR)) {
    std::string const prefix =
      exe_dir.substr(0, exe_dir.size() - cmStrLen(CMAKE_BIN_DIR));
    cmSystemToolsCMakeRoot = cmStrCat(prefix, CMAKE_DATA_DIR);
    if (cmSystemTools::FileExists(
          cmStrCat(prefix, CMAKE_DOC_DIR "/html/index.html"))) {
      cmSystemToolsHTMLDoc = cmStrCat(prefix, CMAKE_DOC_DIR "/html");
    }
  }
  if (cmSystemToolsCMakeRoot.empty() ||
      !cmSystemTools::FileExists(
        cmStrCat(cmSystemToolsCMakeRoot, "/Modules/CMake.cmake"))) {
    // Build tree has "<build>/bin[/<config>]/cmake" and
    // "<build>/CMakeFiles/CMakeSourceDir.txt".
    std::string dir = cmSystemTools::GetFilenamePath(exe_dir);
    std::string src_dir_txt = cmStrCat(dir, "/CMakeFiles/CMakeSourceDir.txt");
    cmsys::ifstream fin(src_dir_txt.c_str());
    std::string src_dir;
    if (fin && cmSystemTools::GetLineFromStream(fin, src_dir) &&
        cmSystemTools::FileIsDirectory(src_dir)) {
      cmSystemToolsCMakeRoot = src_dir;
    } else {
      dir = cmSystemTools::GetFilenamePath(dir);
      src_dir_txt = cmStrCat(dir, "/CMakeFiles/CMakeSourceDir.txt");
      cmsys::ifstream fin2(src_dir_txt.c_str());
      if (fin2 && cmSystemTools::GetLineFromStream(fin2, src_dir) &&
          cmSystemTools::FileIsDirectory(src_dir)) {
        cmSystemToolsCMakeRoot = src_dir;
      }
    }
    if (!cmSystemToolsCMakeRoot.empty() && cmSystemToolsHTMLDoc.empty() &&
        cmSystemTools::FileExists(
          cmStrCat(dir, "/Utilities/Sphinx/html/index.html"))) {
      cmSystemToolsHTMLDoc = cmStrCat(dir, "/Utilities/Sphinx/html");
    }
  }
#else
  // Bootstrap build knows its source.
  cmSystemToolsCMakeRoot = CMAKE_BOOTSTRAP_SOURCE_DIR;
#endif
}